

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::FetchOperands(Instr *this,Opnd **argsOpnd,uint argsOpndLength)

{
  bool bVar1;
  Opnd **ppOStack_18;
  uint argsOpndLength_local;
  Opnd **argsOpnd_local;
  Instr *this_local;
  
  ppOStack_18 = argsOpnd;
  argsOpnd_local = (Opnd **)this;
  bVar1 = ForEachCallDirectArgOutInstrBackward<IR::Instr::FetchOperands(IR::Opnd**,unsigned_int)::__0>
                    (this,(anon_class_8_1_8901db52)&stack0xffffffffffffffe8,argsOpndLength);
  return bVar1;
}

Assistant:

bool
Instr::FetchOperands(_Out_writes_(argsOpndLength) IR::Opnd **argsOpnd, uint argsOpndLength)
{
    return this->ForEachCallDirectArgOutInstrBackward([&](IR::Instr *argOutInstr, uint argNum)
    {
        argsOpnd[argNum] = argOutInstr->GetSrc1();
        return argNum == 0;
    }, argsOpndLength);
}